

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,AssignmentStatement *ptr)

{
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"assignment stmt",&local_21);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  arrow(this,ptr,ptr->assignment);
  (**(ptr->assignment->super_Base)._vptr_Base)(ptr->assignment,this);
  return;
}

Assistant:

void gv_visitor::visit(AssignmentStatement* ptr) {
    box(ptr, "assignment stmt");
    arrow(ptr, ptr->assignment);
    ptr->assignment->accept(this);
}